

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall
cmComputeLinkInformation::FeatureDescriptor::FeatureDescriptor
          (FeatureDescriptor *this,string *name,string *itemPathFormat,string *itemNameFormat)

{
  string *itemNameFormat_local;
  string *itemPathFormat_local;
  string *name_local;
  FeatureDescriptor *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  this->Supported = true;
  std::__cxx11::string::string((string *)&this->Prefix);
  std::__cxx11::string::string((string *)&this->Suffix);
  std::__cxx11::string::string((string *)&this->ItemPathFormat,(string *)itemPathFormat);
  std::__cxx11::string::string((string *)&this->ItemNameFormat,(string *)itemNameFormat);
  return;
}

Assistant:

cmComputeLinkInformation::FeatureDescriptor::FeatureDescriptor(
  std::string name, std::string itemPathFormat, std::string itemNameFormat)
  : Name(std::move(name))
  , Supported(true)
  , ItemPathFormat(std::move(itemPathFormat))
  , ItemNameFormat(std::move(itemNameFormat))
{
}